

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

region * visible_region_at(level *lev,xchar x,xchar y)

{
  int iVar1;
  region **pprVar2;
  region *reg;
  boolean bVar3;
  long lVar4;
  
  iVar1 = lev->n_regions;
  if (0 < (long)iVar1) {
    pprVar2 = lev->regions;
    lVar4 = 0;
    do {
      reg = pprVar2[lVar4];
      bVar3 = inside_region(reg,(int)x,(int)y);
      if (((bVar3 != '\0') && (reg->visible != '\0')) && (reg->ttl != 0)) {
        return reg;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return (region *)0x0;
}

Assistant:

struct region *visible_region_at(struct level *lev, xchar x, xchar y)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (inside_region(lev->regions[i], x, y) && lev->regions[i]->visible &&
		lev->regions[i]->ttl != 0)
	    return lev->regions[i];
    return NULL;
}